

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.cc
# Opt level: O0

args_t parse(string *s)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  runtime_error *prVar8;
  char **extraout_RDX;
  size_t in_RSI;
  args_t aVar9;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  string local_268 [32];
  value_type local_248;
  string local_228 [32];
  value_type local_208;
  undefined1 local_1e8 [8];
  string str;
  int i;
  int len;
  char c;
  char container_start;
  bool escaped;
  bool in_container;
  bool in_token;
  long local_1a8;
  ostringstream token;
  undefined1 local_30 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argv;
  string *s_local;
  
  argv.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = in_RSI;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  ensure_one_newline((string *)local_1e8,
                     (string *)
                     argv.
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl._M_node._M_size);
  len._0_1_ = '\0';
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  iVar5 = std::__cxx11::string::length();
  for (str.field_2._12_4_ = 0; (int)str.field_2._12_4_ < iVar5;
      str.field_2._12_4_ = str.field_2._12_4_ + 1) {
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_1e8);
    cVar1 = *pcVar7;
    iVar6 = (int)cVar1;
    if ((iVar6 - 9U < 2) || (iVar6 == 0x20)) {
      if (bVar2) {
        if (bVar3) {
          std::operator<<((ostream *)&local_1a8,cVar1);
        }
        else if (bVar4) {
          bVar4 = false;
          std::operator<<((ostream *)&local_1a8,cVar1);
        }
        else {
          bVar2 = false;
          std::__cxx11::ostringstream::str();
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_30,&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::string(local_228);
          std::__cxx11::ostringstream::str((string *)&local_1a8);
          std::__cxx11::string::~string(local_228);
          std::ios::clear((int)&local_1a8 + (int)*(undefined8 *)(local_1a8 + -0x18));
        }
      }
    }
    else if ((iVar6 == 0x22) || (iVar6 == 0x27)) {
      if (bVar4) {
        std::operator<<((ostream *)&local_1a8,cVar1);
        bVar4 = false;
      }
      else if (bVar2) {
        if (!bVar3) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"Parse Error! Bad quotes");
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (cVar1 == (char)len) {
          bVar3 = false;
          bVar2 = false;
          std::__cxx11::ostringstream::str();
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_30,&local_248);
          std::__cxx11::string::~string((string *)&local_248);
          std::__cxx11::string::string(local_268);
          std::__cxx11::ostringstream::str((string *)&local_1a8);
          std::__cxx11::string::~string(local_268);
          std::ios::clear((int)&local_1a8 + (int)*(undefined8 *)(local_1a8 + -0x18));
        }
        else {
          std::operator<<((ostream *)&local_1a8,cVar1);
        }
      }
      else {
        bVar2 = true;
        bVar3 = true;
        len._0_1_ = cVar1;
      }
    }
    else if (iVar6 == 0x5c) {
      if ((bVar3) &&
         (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_1e8), *pcVar7 != (char)len)
         ) {
        std::operator<<((ostream *)&local_1a8,cVar1);
      }
      else if (bVar4) {
        std::operator<<((ostream *)&local_1a8,cVar1);
      }
      else {
        bVar4 = true;
      }
    }
    else {
      if (!bVar2) {
        bVar2 = true;
      }
      std::operator<<((ostream *)&local_1a8,cVar1);
    }
  }
  if (bVar3) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Parse Error! Still in container\n");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (!bVar4) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list(&local_280,
           (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
    args_t::args_t((args_t *)s,&local_280);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list(&local_280);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
    aVar9.argv = extraout_RDX;
    aVar9._0_8_ = s;
    return aVar9;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,"Parse Error! Unused escape (\\)\n");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

args_t parse(const string &s) {
    list<string> argv;
    ostringstream token;

    bool in_token;
    bool in_container;
    bool escaped;
    char container_start;
    char c;
    int len;
    int i;

    string str = ensure_one_newline(s);

    container_start = 0;
    in_token = false;
    in_container = false;
    escaped = false;

    len = static_cast<int>(str.length());

    for (i = 0; i < len; i++) {
        c = str[i];

        switch (c) {
            /* handle whitespace */
            case ' ':
            case '\t':
            case '\n':
                if (!in_token)
                    continue;

                if (in_container) {
                    token << c;
                    continue;
                }

                if (escaped) {
                    escaped = false;
                    token << c;
                    continue;
                }

                /* if reached here, we're at end of token */
                in_token = false;
                argv.push_back(token.str());
                token.str(string());
                token.clear();
                break;

                /* handle quotes */
            case '\'':
            case '\"':

                if (escaped) {
                    token << c;
                    escaped = false;
                    continue;
                }

                if (!in_token) {
                    in_token = true;
                    in_container = true;
                    container_start = c;
                    continue;
                }

                if (in_container) {
                    if (c == container_start) {
                        in_container = false;
                        in_token = false;
                        argv.push_back(token.str());
                        token.str(string());
                        token.clear();
                        continue;
                    } else {
                        token << c;
                        continue;
                    }
                }

                /* XXX in this case, we:
                 *    1. have a quote
                 *    2. are in a token
                 *    3. and not in a container
                 * e.g.
                 *    hell"o
                 *
                 * what'str done here appears shell-dependent,
                 * but overall, it'str an error.... i *think*
                 */
                throw runtime_error("Parse Error! Bad quotes");
            case '\\':

                if (in_container && str[i + 1] != container_start) {
                    token << c;
                    continue;
                }

                if (escaped) {
                    token << c;
                    continue;
                }

                escaped = true;
                break;

            default:
                if (!in_token) {
                    in_token = true;
                }

                token << c;
        }
    }

    if (in_container)
        throw runtime_error("Parse Error! Still in container\n");

    if (escaped)
        throw runtime_error("Parse Error! Unused escape (\\)\n");

    return args_t(argv);
}